

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  FILE *pFVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  long *returnvalue;
  void *returnvalue_00;
  long lVar7;
  void *returnvalue_01;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  UserData udata;
  int iVar11;
  long lVar12;
  double *pdVar13;
  double extraout_XMM0_Qa;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  int retval;
  undefined8 *local_148;
  void *local_140;
  FILE *local_138;
  void *local_130;
  SUNContext ctx;
  FILE *local_120;
  FILE *local_118;
  void *local_110;
  void *local_108;
  double dStack_100;
  double local_f0;
  ulong local_e8;
  MRIStepInnerStepper inner_stepper;
  sunrealtype t;
  void *inner_arkode_mem;
  void *arkode_mem;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nffi;
  long nfse;
  long netf;
  long nstf_a;
  long nstf;
  long nsts;
  double local_68;
  double local_58;
  long nffe;
  long nfsi;
  
  arkode_mem = (void *)0x0;
  inner_arkode_mem = (void *)0x0;
  inner_stepper = (MRIStepInnerStepper)0x0;
  retval = SUNContext_Create(0,&ctx);
  iVar11 = 1;
  iVar4 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar4 == 0) {
    returnvalue = (long *)malloc(0x30);
    iVar4 = check_retval(returnvalue,"malloc",2);
    if (iVar4 == 0) {
      *returnvalue = 200;
      returnvalue[3] = 0x400c000000000000;
      returnvalue[4] = 0x3fd0000000000000;
      returnvalue[5] = 0x3eb0c6f7a0b5ed8d;
      returnvalue[1] = 0x3f747ae147ae147b;
      returnvalue[2] = 0x3ff0000000000000;
      puts("\n1D Advection-Reaction example problem:");
      printf("    N = %li,  NEQ = %li\n",*returnvalue,600);
      printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",returnvalue[2],returnvalue[3],
             returnvalue[5]);
      printf("    advection coefficient:  c = %g\n",returnvalue[4]);
      printf("    reltol = %.1e,  abstol = %.1e\n\n",0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb);
      returnvalue_00 = (void *)N_VNew_Serial(600,ctx);
      iVar4 = check_retval(returnvalue_00,"N_VNew_Serial",0);
      if (iVar4 == 0) {
        lVar10 = *returnvalue;
        local_108 = (void *)returnvalue[2];
        dStack_100 = 0.0;
        local_130 = (void *)returnvalue[3];
        local_140 = (void *)returnvalue[1];
        lVar7 = N_VGetArrayPointer(returnvalue_00);
        dStack_100 = (double)local_130 / (double)local_108;
        lVar12 = 0;
        if (lVar10 < 1) {
          lVar10 = lVar12;
        }
        pdVar13 = (double *)(lVar7 + 0x10);
        for (; lVar10 != lVar12; lVar12 = lVar12 + 1) {
          dVar15 = (double)lVar12 * (double)local_140 + -0.5;
          dVar15 = exp((-dVar15 * dVar15) / 0.1);
          dVar15 = dVar15 * 0.1;
          pdVar13[-2] = dVar15 + (double)local_108;
          pdVar13[-1] = dVar15 + dStack_100;
          *pdVar13 = (double)local_130 + dVar15;
          pdVar13 = pdVar13 + 3;
        }
        retval = 0;
        iVar11 = 1;
        iVar4 = check_retval(&retval,"SetIC",1);
        if (iVar4 == 0) {
          returnvalue_01 = (void *)N_VClone(returnvalue_00);
          iVar4 = check_retval(returnvalue_01,"N_VClone",0);
          if (iVar4 == 0) {
            pvVar8 = (void *)N_VClone(returnvalue_00);
            iVar4 = check_retval(pvVar8,"N_VClone",0);
            if (iVar4 == 0) {
              pvVar9 = (void *)N_VClone(returnvalue_00);
              iVar4 = check_retval(pvVar9,"N_VClone",0);
              if (iVar4 == 0) {
                local_108 = pvVar9;
                N_VConst(0,returnvalue_01);
                pvVar9 = (void *)N_VGetArrayPointer(returnvalue_01);
                iVar4 = check_retval(pvVar9,"N_VGetArrayPointer",0);
                if (iVar4 == 0) {
                  for (lVar10 = 0; lVar10 != 0x12c0; lVar10 = lVar10 + 0x18) {
                    *(undefined8 *)((long)pvVar9 + lVar10) = 0x3ff0000000000000;
                  }
                  local_130 = pvVar8;
                  N_VConst(0,pvVar8);
                  pvVar9 = (void *)N_VGetArrayPointer(pvVar8);
                  iVar4 = check_retval(pvVar9,"N_VGetArrayPointer",0);
                  pvVar8 = local_108;
                  if (iVar4 == 0) {
                    for (lVar10 = 8; lVar10 != 0x12c8; lVar10 = lVar10 + 0x18) {
                      *(undefined8 *)((long)pvVar9 + lVar10) = 0x3ff0000000000000;
                    }
                    N_VConst(0,local_108);
                    pvVar8 = (void *)N_VGetArrayPointer(pvVar8);
                    iVar4 = check_retval(pvVar8,"N_VGetArrayPointer",0);
                    if (iVar4 == 0) {
                      for (lVar10 = 0x10; lVar10 != 0x12d0; lVar10 = lVar10 + 0x18) {
                        *(undefined8 *)((long)pvVar8 + lVar10) = 0x3ff0000000000000;
                      }
                      pvVar8 = (void *)SUNBandMatrix(600,4,4,ctx);
                      iVar4 = check_retval(pvVar8,"SUNBandMatrix",0);
                      if (iVar4 == 0) {
                        pvVar9 = (void *)SUNLinSol_Band(returnvalue_00,pvVar8,ctx);
                        iVar4 = check_retval(pvVar9,"SUNLinSol_Band",0);
                        if (iVar4 == 0) {
                          local_140 = (void *)ARKStepCreate(0,0,ff,returnvalue_00,ctx);
                          inner_arkode_mem = local_140;
                          iVar4 = check_retval(local_140,"ARKStepCreate",0);
                          if (iVar4 == 0) {
                            retval = ARKodeSetUserData(local_140,returnvalue);
                            iVar11 = 1;
                            iVar4 = check_retval(&retval,"ARKodeSetUserData",1);
                            if (iVar4 == 0) {
                              retval = ARKStepSetTableNum(local_140,0x68,0xffffffffffffffff);
                              iVar11 = 1;
                              iVar4 = check_retval(&retval,"ARKStepSetTableNum",1);
                              if (iVar4 == 0) {
                                retval = ARKodeSStolerances(0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb,
                                                            local_140);
                                iVar11 = 1;
                                iVar4 = check_retval(&retval,"ARKodeSStolerances",1);
                                if (iVar4 == 0) {
                                  retval = ARKodeSetLinearSolver(local_140,pvVar9,pvVar8);
                                  iVar11 = 1;
                                  iVar4 = check_retval(&retval,"ARKodeSetLinearSolver",1);
                                  if (iVar4 == 0) {
                                    retval = ARKodeSetJacFn(local_140,Jf);
                                    iVar11 = 1;
                                    iVar4 = check_retval(&retval,"ARKodeSetJacFn",1);
                                    if (iVar4 == 0) {
                                      retval = ARKStepCreateMRIStepInnerStepper
                                                         (local_140,&inner_stepper);
                                      iVar11 = 1;
                                      iVar4 = check_retval(&retval,
                                                  "ARKStepCreateMRIStepInnerStepper",1);
                                      if (iVar4 == 0) {
                                        local_110 = (void *)MRIStepCreate(0,fs,0,returnvalue_00,
                                                                          inner_stepper,ctx);
                                        arkode_mem = local_110;
                                        iVar4 = check_retval(local_110,"MRIStepCreate",0);
                                        if (iVar4 == 0) {
                                          retval = ARKodeSetUserData(local_110,returnvalue);
                                          iVar11 = 1;
                                          iVar4 = check_retval(&retval,"ARKodeSetUserData",1);
                                          if (iVar4 == 0) {
                                            retval = ARKodeSetFixedStep(0x3f847ae147ae147b,local_110
                                                                       );
                                            iVar11 = 1;
                                            iVar4 = check_retval(&retval,"ARKodeSetFixedStep",1);
                                            if (iVar4 == 0) {
                                              local_138 = fopen("mesh.txt","w");
                                              lVar10 = 0;
                                              while (lVar10 != 0xc9) {
                                                local_148 = (undefined8 *)lVar10;
                                                fprintf(local_138,"  %.16e\n",
                                                        (double)lVar10 * (double)returnvalue[1]);
                                                lVar10 = (long)local_148 + 1;
                                              }
                                              fclose(local_138);
                                              local_138 = fopen("u.txt","w");
                                              local_118 = fopen("v.txt","w");
                                              local_120 = fopen("w.txt","w");
                                              local_148 = (undefined8 *)
                                                          N_VGetArrayPointer(returnvalue_00);
                                              iVar4 = check_retval(local_148,"N_VGetArrayPointer",0)
                                              ;
                                              if (iVar4 == 0) {
                                                for (lVar10 = 0; pFVar3 = local_138,
                                                    lVar10 != 0x12c0; lVar10 = lVar10 + 0x18) {
                                                  fprintf(local_138," %.16e",
                                                          *(undefined8 *)((long)local_148 + lVar10))
                                                  ;
                                                }
                                                fprintf(local_138," %.16e",*local_148);
                                                fputc(10,pFVar3);
                                                for (lVar10 = 8; pFVar3 = local_118,
                                                    lVar10 != 0x12c8; lVar10 = lVar10 + 0x18) {
                                                  fprintf(local_118," %.16e",
                                                          *(undefined8 *)((long)local_148 + lVar10))
                                                  ;
                                                }
                                                fprintf(local_118," %.16e",local_148[1]);
                                                fputc(10,pFVar3);
                                                for (lVar10 = 0x10; pFVar3 = local_120,
                                                    lVar10 != 0x12d0; lVar10 = lVar10 + 0x18) {
                                                  fprintf(local_120," %.16e",
                                                          *(undefined8 *)((long)local_148 + lVar10))
                                                  ;
                                                }
                                                fprintf(local_120," %.16e",local_148[2]);
                                                fputc(10,pFVar3);
                                                t = 0.0;
                                                puts(
                                                  "        t      ||u||_rms   ||v||_rms   ||w||_rms"
                                                  );
                                                puts(
                                                  "   ----------------------------------------------"
                                                  );
                                                local_f0 = 0.1;
                                                for (local_e8 = 0; (int)local_e8 != 100;
                                                    local_e8 = (ulong)((int)local_e8 + 1)) {
                                                  retval = ARKodeEvolve(local_f0,local_110,
                                                                        returnvalue_00,&t,1);
                                                  iVar4 = check_retval(&retval,"ARKodeEvolve",1);
                                                  if (iVar4 != 0) break;
                                                  dVar15 = (double)N_VWL2Norm(returnvalue_00,
                                                                              returnvalue_01);
                                                  local_58 = (dVar15 * dVar15) / 200.0;
                                                  local_68 = (double)N_VWL2Norm(returnvalue_00,
                                                                                local_130);
                                                  uVar5 = N_VWL2Norm(returnvalue_00,local_108);
                                                  auVar14._0_8_ =
                                                       extraout_XMM0_Qa * extraout_XMM0_Qa;
                                                  auVar14._8_8_ = local_68 * local_68;
                                                  auVar14 = divpd(auVar14,_DAT_00104040);
                                                  auVar1._8_8_ = -(ulong)(0.0 < auVar14._8_8_);
                                                  auVar1._0_8_ = -(ulong)(0.0 < auVar14._0_8_);
                                                  uVar6 = movmskpd(uVar5,auVar1);
                                                  if ((uVar6 & 2) == 0) {
                                                    dVar15 = 0.0;
                                                  }
                                                  else {
                                                    dVar15 = SQRT(auVar14._8_8_);
                                                  }
                                                  if ((uVar6 & 1) == 0) {
                                                    dVar16 = 0.0;
                                                  }
                                                  else {
                                                    dVar16 = SQRT(auVar14._0_8_);
                                                  }
                                                  printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",t,
                                                         -(ulong)(0.0 < local_58) &
                                                         (ulong)SQRT(local_58),dVar15,dVar16);
                                                  for (lVar10 = 0; pFVar3 = local_138,
                                                      lVar10 != 0x12c0; lVar10 = lVar10 + 0x18) {
                                                    fprintf(local_138," %.16e",
                                                            *(undefined8 *)
                                                             ((long)local_148 + lVar10));
                                                  }
                                                  fprintf(local_138," %.16e",*local_148);
                                                  fputc(10,pFVar3);
                                                  for (lVar10 = 8; pFVar3 = local_118,
                                                      lVar10 != 0x12c8; lVar10 = lVar10 + 0x18) {
                                                    fprintf(local_118," %.16e",
                                                            *(undefined8 *)
                                                             ((long)local_148 + lVar10));
                                                  }
                                                  fprintf(local_118," %.16e",local_148[1]);
                                                  fputc(10,pFVar3);
                                                  for (lVar10 = 0x10; pFVar3 = local_120,
                                                      lVar10 != 0x12d0; lVar10 = lVar10 + 0x18) {
                                                    fprintf(local_120," %.16e",
                                                            *(undefined8 *)
                                                             ((long)local_148 + lVar10));
                                                  }
                                                  fprintf(local_120," %.16e",local_148[2]);
                                                  fputc(10,pFVar3);
                                                  dVar15 = local_f0 + 0.1;
                                                  local_f0 = 10.0;
                                                  if (dVar15 <= 10.0) {
                                                    local_f0 = dVar15;
                                                  }
                                                }
                                                puts(
                                                  "   ----------------------------------------------"
                                                  );
                                                fclose(local_138);
                                                fclose(local_118);
                                                fclose(local_120);
                                                pvVar2 = local_110;
                                                retval = ARKodeGetNumSteps(local_110,&nsts);
                                                check_retval(&retval,"ARKodeGetNumSteps",1);
                                                retval = MRIStepGetNumRhsEvals(pvVar2,&nfse,&nfsi);
                                                check_retval(&retval,"MRIStepGetNumRhsEvals",1);
                                                pvVar2 = local_140;
                                                retval = ARKodeGetNumSteps(local_140,&nstf);
                                                check_retval(&retval,"ARKodeGetNumSteps",1);
                                                retval = ARKodeGetNumStepAttempts(pvVar2,&nstf_a);
                                                check_retval(&retval,"ARKodeGetNumStepAttempts",1);
                                                retval = ARKStepGetNumRhsEvals(pvVar2,&nffe,&nffi);
                                                check_retval(&retval,"ARKStepGetNumRhsEvals",1);
                                                retval = ARKodeGetNumLinSolvSetups(pvVar2,&nsetups);
                                                check_retval(&retval,"ARKodeGetNumLinSolvSetups",1);
                                                retval = ARKodeGetNumErrTestFails(pvVar2,&netf);
                                                check_retval(&retval,"ARKodeGetNumErrTestFails",1);
                                                retval = ARKodeGetNumNonlinSolvIters(pvVar2,&nni);
                                                check_retval(&retval,"ARKodeGetNumNonlinSolvIters",1
                                                            );
                                                retval = ARKodeGetNumNonlinSolvConvFails
                                                                   (pvVar2,&ncfn);
                                                check_retval(&retval,
                                                  "ARKodeGetNumNonlinSolvConvFails",1);
                                                retval = ARKodeGetNumJacEvals(pvVar2,&nje);
                                                check_retval(&retval,"ARKodeGetNumJacEvals",1);
                                                retval = ARKodeGetNumLinRhsEvals(pvVar2,&nfeLS);
                                                check_retval(&retval,"ARKodeGetNumLinRhsEvals",1);
                                                puts("\nFinal Solver Statistics:");
                                                iVar11 = 0;
                                                printf("   Slow Steps: nsts = %li\n",nsts);
                                                printf(
                                                  "   Fast Steps: nstf = %li (attempted = %li)\n",
                                                  nstf,nstf_a);
                                                printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",
                                                       nfse,nffi);
                                                printf(
                                                  "   Total number of fast error test failures = %li\n"
                                                  ,netf);
                                                printf("   Total linear solver setups = %li\n",
                                                       nsetups);
                                                printf(
                                                  "   Total RHS evals for setting up the linear system = %li\n"
                                                  ,nfeLS);
                                                printf(
                                                  "   Total number of Jacobian evaluations = %li\n",
                                                  nje);
                                                printf(
                                                  "   Total number of Newton iterations = %li\n",nni
                                                  );
                                                printf(
                                                  "   Total number of nonlinear solver convergence failures = %li\n"
                                                  ,ncfn);
                                                free(returnvalue);
                                                ARKodeFree(&inner_arkode_mem);
                                                MRIStepInnerStepper_Free(&inner_stepper);
                                                ARKodeFree(&arkode_mem);
                                                SUNLinSolFree(pvVar9);
                                                SUNMatDestroy(pvVar8);
                                                N_VDestroy(returnvalue_00);
                                                N_VDestroy(returnvalue_01);
                                                N_VDestroy(local_130);
                                                N_VDestroy(local_108);
                                                SUNContext_Free(&ctx);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int main(int argc, char* argv[])
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);  /* initial time                    */
  sunrealtype Tf     = SUN_RCONST(10.0); /* final time                      */
  int Nt             = 100;              /* total number of output times    */
  int Nvar           = 3;                /* number of solution fields       */
  sunindextype N     = 200;              /* spatial mesh size (N intervals) */
  sunrealtype a      = SUN_RCONST(1.0);  /* problem parameters              */
  sunrealtype b      = SUN_RCONST(3.5);
  sunrealtype c      = SUN_RCONST(0.25);
  sunrealtype ep     = SUN_RCONST(1.0e-6); /* stiffness parameter */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances          */
  sunrealtype abstol = SUN_RCONST(1.0e-10);

  /* general problem variables */
  sunrealtype hs;                           /* slow step size                 */
  int retval;                               /* reusable return flag           */
  N_Vector y                        = NULL; /* empty solution vector          */
  N_Vector umask                    = NULL; /* empty mask vectors             */
  N_Vector vmask                    = NULL;
  N_Vector wmask                    = NULL;
  SUNMatrix A                       = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS                = NULL; /* empty linear solver structure  */
  void* arkode_mem                  = NULL; /* empty ARKode memory structure  */
  void* inner_arkode_mem            = NULL; /* empty ARKode memory structure  */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper                  */
  sunrealtype t, dTout, tout;               /* current/output time data       */
  sunrealtype u, v, w;                      /* temp data values               */
  FILE *FID, *UFID, *VFID, *WFID;           /* output file pointers           */
  int iout;                                 /* output counter                 */
  long int nsts, nstf, nstf_a, netf;        /* step stats                     */
  long int nfse, nfsi, nffe, nffi;          /* RHS stats                      */
  long int nsetups, nje, nfeLS;             /* linear solver stats            */
  long int nni, ncfn;                       /* nonlinear solver stats         */
  sunindextype NEQ;                         /* number of equations            */
  sunindextype i;                           /* counter                        */
  UserData udata    = NULL;                 /* user data pointer              */
  sunrealtype* data = NULL;                 /* array for vector data          */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* allocate udata structure */
  udata = (UserData)malloc(sizeof(*udata));
  if (check_retval((void*)udata, "malloc", 2)) { return 1; }

  /* store the inputs in the UserData structure */
  udata->N  = N;
  udata->a  = a;
  udata->b  = b;
  udata->c  = c;
  udata->ep = ep;
  udata->dx = SUN_RCONST(1.0) / N; /* periodic BC, divide by N not N-1 */

  /* set total allocated vector length */
  NEQ = Nvar * udata->N;

  /* set the slow step size */
  hs = SUN_RCONST(0.5) * (udata->dx / SUNRabs(c));

  /* Initial problem output */
  printf("\n1D Advection-Reaction example problem:\n");
  printf("    N = %li,  NEQ = %li\n", (long int)udata->N, (long int)NEQ);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         udata->a, udata->b, udata->ep);
  printf("    advection coefficient:  c = %" GSYM "\n", udata->c);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Create solution vector */
  y = N_VNew_Serial(NEQ, ctx); /* Create vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  /* Set initial condition */
  retval = SetIC(y, udata);
  if (check_retval(&retval, "SetIC", 1)) { return 1; }

  /* Create vector masks */
  umask = N_VClone(y);
  if (check_retval((void*)umask, "N_VClone", 0)) { return 1; }

  vmask = N_VClone(y);
  if (check_retval((void*)vmask, "N_VClone", 0)) { return 1; }

  wmask = N_VClone(y);
  if (check_retval((void*)wmask, "N_VClone", 0)) { return 1; }

  /* Set mask array values for each solution component */
  N_VConst(0.0, umask);
  data = N_VGetArrayPointer(umask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 0)] = SUN_RCONST(1.0); }

  N_VConst(0.0, vmask);
  data = N_VGetArrayPointer(vmask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 1)] = SUN_RCONST(1.0); }

  N_VConst(0.0, wmask);
  data = N_VGetArrayPointer(wmask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 2)] = SUN_RCONST(1.0); }

  /*
   * Create the fast integrator and set options
   */

  /* Initialize matrix and linear solver data structures */
  A = SUNBandMatrix(NEQ, 4, 4, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return 1; }

  LS = SUNLinSol_Band(y, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return 1; }

  /* Initialize the fast integrator. Specify the implicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(NULL, ff, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, ARKODE_ARK324L2SA_DIRK_4_2_3, -1);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Specify fast tolerances */
  retval = ARKodeSStolerances(inner_arkode_mem, reltol, abstol);
  if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }

  /* Attach matrix and linear solver */
  retval = ARKodeSetLinearSolver(inner_arkode_mem, LS, A);
  if (check_retval(&retval, "ARKodeSetLinearSolver", 1)) { return 1; }

  /* Set the Jacobian routine */
  retval = ARKodeSetJacFn(inner_arkode_mem, Jf);
  if (check_retval(&retval, "ARKodeSetJacFn", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKStepCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKStepCreateMRIStepInnerStepper", 1))
  {
    return 1;
  }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass udata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* output spatial mesh to disk (add extra point for periodic BC) */
  FID = fopen("mesh.txt", "w");
  for (i = 0; i < N + 1; i++)
  {
    fprintf(FID, "  %.16" ESYM "\n", udata->dx * i);
  }
  fclose(FID);

  /* Open output stream for results, access data arrays */
  UFID = fopen("u.txt", "w");
  VFID = fopen("v.txt", "w");
  WFID = fopen("w.txt", "w");

  /* output initial condition to disk (extra output for periodic BC) */
  data = N_VGetArrayPointer(y);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }

  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM, data[IDX(i, 0)]); }
  fprintf(UFID, " %.16" ESYM, data[IDX(0, 0)]);
  fprintf(UFID, "\n");

  for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM, data[IDX(i, 1)]); }
  fprintf(VFID, " %.16" ESYM, data[IDX(0, 1)]);
  fprintf(VFID, "\n");

  for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM, data[IDX(i, 2)]); }
  fprintf(WFID, " %.16" ESYM, data[IDX(0, 2)]);
  fprintf(WFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration,
     then prints results.  Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms   ||v||_rms   ||w||_rms\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* access/print solution statistics */
    u = N_VWL2Norm(y, umask);
    u = SUNRsqrt(u * u / N);
    v = N_VWL2Norm(y, vmask);
    v = SUNRsqrt(v * v / N);
    w = N_VWL2Norm(y, wmask);
    w = SUNRsqrt(w * w / N);
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           u, v, w);

    /* output results to disk (extr output for periodic BC) */
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM, data[IDX(i, 0)]); }
    fprintf(UFID, " %.16" ESYM, data[IDX(0, 0)]);
    fprintf(UFID, "\n");

    for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM, data[IDX(i, 1)]); }
    fprintf(VFID, " %.16" ESYM, data[IDX(0, 1)]);
    fprintf(VFID, "\n");

    for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM, data[IDX(i, 2)]); }
    fprintf(WFID, " %.16" ESYM, data[IDX(0, 2)]);
    fprintf(WFID, "\n");

    /* successful solve: update output time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);
  fclose(VFID);
  fclose(WFID);

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = MRIStepGetNumRhsEvals(arkode_mem, &nfse, &nfsi);
  check_retval(&retval, "MRIStepGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumStepAttempts(inner_arkode_mem, &nstf_a);
  check_retval(&retval, "ARKodeGetNumStepAttempts", 1);
  retval = ARKStepGetNumRhsEvals(inner_arkode_mem, &nffe, &nffi);
  check_retval(&retval, "ARKStepGetNumRhsEvals", 1);
  retval = ARKodeGetNumLinSolvSetups(inner_arkode_mem, &nsetups);
  check_retval(&retval, "ARKodeGetNumLinSolvSetups", 1);
  retval = ARKodeGetNumErrTestFails(inner_arkode_mem, &netf);
  check_retval(&retval, "ARKodeGetNumErrTestFails", 1);
  retval = ARKodeGetNumNonlinSolvIters(inner_arkode_mem, &nni);
  check_retval(&retval, "ARKodeGetNumNonlinSolvIters", 1);
  retval = ARKodeGetNumNonlinSolvConvFails(inner_arkode_mem, &ncfn);
  check_retval(&retval, "ARKodeGetNumNonlinSolvConvFails", 1);
  retval = ARKodeGetNumJacEvals(inner_arkode_mem, &nje);
  check_retval(&retval, "ARKodeGetNumJacEvals", 1);
  retval = ARKodeGetNumLinRhsEvals(inner_arkode_mem, &nfeLS);
  check_retval(&retval, "ARKodeGetNumLinRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Slow Steps: nsts = %li\n", nsts);
  printf("   Fast Steps: nstf = %li (attempted = %li)\n", nstf, nstf_a);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nffi);
  printf("   Total number of fast error test failures = %li\n", netf);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);

  /* Clean up and return with successful completion */
  free(udata);                              /* Free user data         */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNLinSolFree(LS);                        /* Free linear solver     */
  SUNMatDestroy(A);                         /* Free matrix            */
  N_VDestroy(y);                            /* Free vectors           */
  N_VDestroy(umask);
  N_VDestroy(vmask);
  N_VDestroy(wmask);
  SUNContext_Free(&ctx); /* Free context */

  return 0;
}